

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O0

int match_rule(ip_rule_t *ipr,packet_t *pkt)

{
  list_head *plVar1;
  int iVar2;
  int local_4c;
  int target;
  int i;
  list_head *__mptr_1;
  list_head *__mptr;
  ip_match_t *ipm;
  packet_t *pkt_local;
  ip_rule_t *ipr_local;
  
  iVar2 = match_ip(ipr,pkt);
  if (iVar2 == 0) {
    ipr_local._4_4_ = 6;
  }
  else {
    for (plVar1 = (ipr->matchs).next; __mptr = plVar1 + -1, plVar1 != &ipr->matchs;
        plVar1 = plVar1->next) {
      if (((__mptr->next != (list_head *)0x0) && (__mptr->next[2].next != (list_head *)0x0)) &&
         (iVar2 = (*(code *)__mptr->next[2].next)(plVar1[-1].prev,pkt), iVar2 == 0)) {
        return 6;
      }
    }
    printf("%s\t: ","match_rule");
    for (local_4c = (int)match_rule::depth; 0 < local_4c; local_4c = local_4c + -1) {
      printf("    ");
    }
    print_rule(ipr);
    if (((ipr->target == 4) && (ipr->target_ext != (ip_target_t *)0x0)) &&
       ((ipr->target_ext->map != (ip_target_map_t *)0x0 &&
        (ipr->target_ext->map->func_target != (_func_int_void_ptr_packet_t_ptr *)0x0)))) {
      ipr_local._4_4_ = (*ipr->target_ext->map->func_target)(ipr->target_ext->data,pkt);
    }
    else if ((ipr->target == 5) && (ipr->target_child != (ip_chain_t *)0x0)) {
      match_rule::depth = match_rule::depth + '\x01';
      ipr_local._4_4_ = match_chain(ipr->target_child,pkt);
      match_rule::depth = match_rule::depth + -1;
      if ((ipr_local._4_4_ == 6) && (ipr->go != '\0')) {
        ipr_local._4_4_ = 3;
      }
    }
    else {
      ipr_local._4_4_ = ipr->target;
    }
  }
  return ipr_local._4_4_;
}

Assistant:

int match_rule(ip_rule_t *ipr, packet_t *pkt)
{
	static int8_t depth = 0;
	if (!match_ip(ipr, pkt)) {
		return TARGET_NONE;
	}

	ip_match_t *ipm = NULL;
	list_for_each_entry(ipm, &ipr->matchs, list) {
		if (ipm->map && ipm->map->func_match) {
			if (!(ipm->map->func_match(ipm->data, pkt))) {
				return TARGET_NONE;
			}
		}
	}

	printf("%s	: ", __FUNCTION__);
	for (int i = depth; i > 0; printf("    "), i--);
	print_rule(ipr);

	if (ipr->target == TARGET_EXT && ipr->target_ext &&
		ipr->target_ext->map && ipr->target_ext->map->func_target) {
		return ipr->target_ext->map->func_target(ipr->target_ext->data, pkt);
	}

	if (ipr->target == TARGET_CHILD && ipr->target_child) {
		depth++;
		int target = match_chain(ipr->target_child, pkt);
		depth--;
		if (target == TARGET_NONE && ipr->go) {
			return TARGET_RETURN;
		} else {
			return target;
		}
	}

	return ipr->target;
}